

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testReader.cpp
# Opt level: O1

int main(void)

{
  FILE *__stream;
  int testdata;
  undefined1 local_14 [4];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Input file:",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"input1.lef",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  __stream = fopen("input1.lef","r");
  LefDefParser::lefrSetMacroCbk(test);
  LefDefParser::lefrSetPinCbk(PinCBK);
  LefDefParser::lefrRead(__stream,"input1.lef",local_14);
  fclose(__stream);
  return 0;
}

Assistant:

int main(){
    const char *Filename = "input1.lef";
    std::cout << "Input file:" << Filename << std::endl;
    FILE *fin = fopen(Filename, "r");
    int testdata;
    lefrSetMacroCbk(test);
    lefrSetPinCbk(PinCBK);
    lefrRead(fin, Filename, &testdata);
    fclose(fin);
}